

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O2

string * __thiscall
logger::Channel::GetPrefix_abi_cxx11_(string *__return_storage_ptr__,Channel *this)

{
  std::mutex::lock(&this->PrefixLock);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->Prefix);
  pthread_mutex_unlock((pthread_mutex_t *)&this->PrefixLock);
  return __return_storage_ptr__;
}

Assistant:

std::string Channel::GetPrefix() const
{
    std::lock_guard<std::mutex> locker(PrefixLock);
    return Prefix;
}